

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# PrintVisitor.cpp
# Opt level: O0

void __thiscall PrintVisitor::visit(PrintVisitor *this,UnaryNode *node)

{
  ostream *poVar1;
  mapped_type *this_00;
  ExpressionNode *pEVar2;
  UnaryNode *in_RSI;
  PrintVisitor *in_RDI;
  PrintVisitor visitor;
  key_type *in_stack_ffffffffffffff58;
  unordered_map<UnaryOperator,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::hash<UnaryOperator>,_std::equal_to<UnaryOperator>,_std::allocator<std::pair<const_UnaryOperator,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  *in_stack_ffffffffffffff60;
  uint indentation;
  undefined1 local_58 [40];
  string local_30 [32];
  UnaryNode *local_10;
  
  poVar1 = in_RDI->stream_;
  local_10 = in_RSI;
  indent_abi_cxx11_(in_RDI);
  poVar1 = std::operator<<(poVar1,local_30);
  poVar1 = std::operator<<(poVar1,"Unary: ");
  UnaryNode::getOperation(local_10);
  this_00 = std::
            unordered_map<UnaryOperator,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::hash<UnaryOperator>,_std::equal_to<UnaryOperator>,_std::allocator<std::pair<const_UnaryOperator,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
            ::at(in_stack_ffffffffffffff60,in_stack_ffffffffffffff58);
  indentation = (uint)((ulong)in_stack_ffffffffffffff60 >> 0x20);
  poVar1 = std::operator<<(poVar1,(string *)this_00);
  std::operator<<(poVar1,"\n");
  std::__cxx11::string::~string(local_30);
  PrintVisitor((PrintVisitor *)this_00,poVar1,indentation);
  pEVar2 = UnaryNode::getTerm((UnaryNode *)0x166f1e);
  (*(pEVar2->super_Node)._vptr_Node[2])(pEVar2,local_58);
  ~PrintVisitor((PrintVisitor *)0x166f44);
  return;
}

Assistant:

void PrintVisitor::visit(const UnaryNode& node)
{
  stream_ << indent() << "Unary: " 
    << UnaryOperationNames.at(node.getOperation()) << "\n";
  auto visitor = PrintVisitor{stream_, indentation_ + 1};
  node.getTerm().accept(visitor);
}